

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QRegion __thiscall
QGraphicsViewPrivate::rubberBandRegion(QGraphicsViewPrivate *this,QWidget *widget,QRect *rect)

{
  int iVar1;
  QStyle *pQVar2;
  QWidget *in_RCX;
  QStyleOption *in_RDX;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QRegion *tmp;
  QStyleHintReturnMask mask;
  QStyleOptionRubberBand option;
  QWidget *this_00;
  QWidget *pQVar3;
  undefined1 in_stack_ffffffffffffff90 [16];
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 local_50 [16];
  undefined8 local_40;
  undefined8 local_38;
  undefined4 local_10;
  undefined1 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  pQVar3 = in_RDI;
  QStyleHintReturnMask::QStyleHintReturnMask((QStyleHintReturnMask *)in_RDI);
  memset(local_50,0xaa,0x48);
  QStyleOptionRubberBand::QStyleOptionRubberBand((QStyleOptionRubberBand *)0xa340ec);
  QStyleOption::initFrom(in_RDX,in_RCX);
  local_40 = *(undefined8 *)in_RCX;
  local_38 = *(undefined8 *)&in_RCX->field_0x8;
  local_c = 0;
  local_10 = 1;
  *(undefined1 **)this_00 = &DAT_aaaaaaaaaaaaaaaa;
  QRegion::QRegion((QRegion *)this_00);
  QRect::adjusted(in_stack_ffffffffffffff90._8_8_,in_stack_ffffffffffffff90._4_4_,
                  in_stack_ffffffffffffff90._0_4_,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3);
  QRegion::operator+=((QRegion *)this_00,(QRect *)&stack0xffffffffffffff90);
  pQVar2 = QWidget::style(in_RDI);
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x36,local_50,in_RDX,&local_60);
  if (iVar1 != 0) {
    QRegion::operator&=((QRegion *)this_00,(QRegion *)&local_58);
  }
  QStyleOptionRubberBand::~QStyleOptionRubberBand((QStyleOptionRubberBand *)0xa341d2);
  QStyleHintReturnMask::~QStyleHintReturnMask((QStyleHintReturnMask *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QRegion)(QRegionData *)in_RDI;
}

Assistant:

QRegion QGraphicsViewPrivate::rubberBandRegion(const QWidget *widget, const QRect &rect) const
{
    QStyleHintReturnMask mask;
    QStyleOptionRubberBand option;
    option.initFrom(widget);
    option.rect = rect;
    option.opaque = false;
    option.shape = QRubberBand::Rectangle;

    QRegion tmp;
    tmp += rect.adjusted(-1, -1, 1, 1);
    if (widget->style()->styleHint(QStyle::SH_RubberBand_Mask, &option, widget, &mask))
        tmp &= mask.region;
    return tmp;
}